

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Fraction __thiscall Matrix::GetCubicNorm(Matrix *this)

{
  Fraction *pFVar1;
  int column;
  long lVar2;
  long lVar3;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  Fraction result;
  Fraction sum;
  Fraction local_50;
  long local_48;
  Fraction local_40;
  Fraction local_38;
  
  Fraction::Fraction(&local_50);
  lVar3 = 0;
  while (lVar3 < this->m_) {
    Fraction::Fraction(&local_38,0);
    __x = extraout_XMM0_Qa;
    local_48 = lVar3;
    for (lVar2 = 0; lVar2 < this->n_; lVar2 = lVar2 + 1) {
      fabs(__x);
      Fraction::operator+=(&local_38,&local_40);
      __x = extraout_XMM0_Qa_00;
    }
    pFVar1 = std::max<Fraction>(&local_50,&local_38);
    local_50 = *pFVar1;
    lVar3 = local_48 + 1;
  }
  return local_50;
}

Assistant:

Fraction Matrix::GetCubicNorm() const {
    Fraction result;
    for (int row = 0; row < m_; ++row) {
        Fraction sum = 0;
        for (int column = 0; column < n_; ++column) {
            sum += fabs(elements_[row][column]);
        }
        result = std::max(result, sum);
    }

    return result;
}